

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool __thiscall FSlide::BounceTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  double dVar1;
  double dVar2;
  line_t *line;
  uint uVar3;
  intercept_t *piVar4;
  ulong uVar5;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_110;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_0084b268;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x1);
  do {
    while( true ) {
      while( true ) {
        piVar4 = FPathTraverse::Next(&local_100);
        if (piVar4 == (intercept_t *)0x0) goto LAB_0051252f;
        if (piVar4->isaline != false) break;
        Printf("PTR_BounceTraverse: not a line?");
      }
      line = (piVar4->d).line;
      uVar5 = ((long)line - (long)lines) * -0x79435e50d79435e5;
      if (0x1af286bca1af286 < (uVar5 >> 3 | uVar5 << 0x3d)) {
        __assert_fail("((size_t)li - (size_t)lines) % sizeof(line_t) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_map.cpp"
                      ,0xc40,"bool FSlide::BounceTraverse(const DVector2 &, const DVector2 &)");
      }
      if ((short)line->flags < 0) goto LAB_0051250b;
      if (((line->flags & 4) == 0) || (line->backsector == (sector_t *)0x0)) break;
      local_110.X = local_100.trace.dx * piVar4->frac + local_100.trace.x;
      local_110.Y = piVar4->frac * local_100.trace.dy + local_100.trace.y;
      P_LineOpening(&local_c0,this->slidemo,line,&local_110,(DVector2 *)0x0,0);
      dVar1 = this->slidemo->Height;
      if ((local_c0.range < dVar1) ||
         ((dVar2 = (this->slidemo->__Pos).Z, local_c0.top < dVar1 + dVar2 ||
          (dVar2 < local_c0.bottom)))) goto LAB_0051250b;
    }
    dVar1 = (this->slidemo->__Pos).X;
    dVar2 = (this->slidemo->__Pos).Y;
    if (((byte)i_compatflags2 & 8) == 0) {
      uVar3 = (uint)(1.52587890625e-05 <
                    ((line->v1->p).X - dVar1) * (line->delta).Y +
                    (dVar2 - (line->v1->p).Y) * (line->delta).X);
    }
    else {
      uVar3 = P_VanillaPointOnLineSide(dVar1,dVar2,line);
    }
  } while (uVar3 != 0);
LAB_0051250b:
  dVar1 = piVar4->frac;
  if (dVar1 < this->bestSlidefrac) {
    this->secondSlidefrac = this->bestSlidefrac;
    this->secondslideline = this->bestslideline;
    this->bestSlidefrac = dVar1;
    this->bestslideline = line;
  }
LAB_0051252f:
  FPathTraverse::~FPathTraverse(&local_100);
  return piVar4 == (intercept_t *)0x0;
}

Assistant:

bool FSlide::BounceTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{

		line_t  *li;

		if (!in->isaline)
		{
			Printf("PTR_BounceTraverse: not a line?");
			continue;
		}

		li = in->d.line;
		assert(((size_t)li - (size_t)lines) % sizeof(line_t) == 0);
		if (li->flags & ML_BLOCKEVERYTHING)
		{
			goto bounceblocking;
		}
		if (!(li->flags&ML_TWOSIDED) || !li->backsector)
		{
			if (P_PointOnLineSide(slidemo->Pos(), li))
				continue;			// don't hit the back side
			goto bounceblocking;
		}


		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));	// set openrange, opentop, openbottom
		if (open.range < slidemo->Height)
			goto bounceblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto bounceblocking;				// mobj is too high

		if (open.bottom > slidemo->Z())
			goto bounceblocking;				// mobj is too low

		continue;			// this line doesn't block movement

		// the line does block movement, see if it is closer than best so far
	bounceblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}
		return false;   // stop
	}
	return true;
}